

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O1

bool __thiscall
absl::lts_20250127::time_internal::cctz::TimeZoneInfo::ResetToBuiltinUTC
          (TimeZoneInfo *this,seconds *offset)

{
  vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
  *this_00;
  TransitionType *tt;
  pointer pTVar1;
  pointer pTVar2;
  int_fast64_t unix_time;
  undefined8 uVar3;
  iterator iVar4;
  seconds *offset_00;
  long lVar5;
  fields fVar6;
  undefined1 local_50 [32];
  
  std::
  vector<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
  ::resize(&this->transition_types_,1);
  pTVar1 = (this->transition_types_).
           super__Vector_base<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pTVar1[-1].utc_offset = (int_least32_t)offset->__r;
  pTVar1[-1].is_dst = false;
  pTVar1[-1].abbr_index = '\0';
  this_00 = &this->transitions_;
  pTVar2 = (this->transitions_).
           super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->transitions_).
      super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
      ._M_impl.super__Vector_impl_data._M_finish != pTVar2) {
    (this->transitions_).
    super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
    ._M_impl.super__Vector_impl_data._M_finish = pTVar2;
  }
  tt = pTVar1 + -1;
  std::
  vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
  ::reserve(this_00,0xc);
  lVar5 = 0;
  do {
    unix_time = *(int_fast64_t *)((long)&DAT_004bc950 + lVar5);
    iVar4 = std::
            vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
            ::_M_emplace_aux<>(this_00,(this->transitions_).
                                       super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                                       ._M_impl.super__Vector_impl_data._M_finish);
    (iVar4._M_current)->unix_time = unix_time;
    (iVar4._M_current)->type_index = '\0';
    LocalTime((absolute_lookup *)local_50,this,unix_time,tt);
    *(undefined4 *)&((iVar4._M_current)->civil_sec).f_.y = local_50._0_4_;
    *(undefined4 *)((long)&((iVar4._M_current)->civil_sec).f_.y + 4) = local_50._4_4_;
    ((iVar4._M_current)->civil_sec).f_.m = local_50[8];
    ((iVar4._M_current)->civil_sec).f_.d = local_50[9];
    ((iVar4._M_current)->civil_sec).f_.hh = local_50[10];
    ((iVar4._M_current)->civil_sec).f_.mm = local_50[0xb];
    *(undefined4 *)&((iVar4._M_current)->civil_sec).f_.ss = local_50._12_4_;
    uVar3._0_1_ = ((iVar4._M_current)->civil_sec).f_.m;
    uVar3._1_1_ = ((iVar4._M_current)->civil_sec).f_.d;
    uVar3._2_1_ = ((iVar4._M_current)->civil_sec).f_.hh;
    uVar3._3_1_ = ((iVar4._M_current)->civil_sec).f_.mm;
    uVar3._4_1_ = ((iVar4._M_current)->civil_sec).f_.ss;
    uVar3._5_3_ = *(undefined3 *)&((iVar4._M_current)->civil_sec).f_.field_0xd;
    fVar6 = detail::step(((iVar4._M_current)->civil_sec).f_.y,uVar3,0xffffffffffffffff);
    offset_00 = (seconds *)(fVar6._8_8_ & 0xffffffffff);
    ((iVar4._M_current)->prev_civil_sec).f_.y = fVar6.y;
    *(seconds **)&((iVar4._M_current)->prev_civil_sec).f_.m = offset_00;
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x60);
  this->default_transition_type_ = '\0';
  FixedOffsetToAbbr_abi_cxx11_((string *)local_50,(cctz *)offset,offset_00);
  std::__cxx11::string::operator=((string *)&this->abbreviations_,(string *)local_50);
  if ((undefined1 *)CONCAT44(local_50._4_4_,local_50._0_4_) != local_50 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_50._4_4_,local_50._0_4_),local_50._16_8_ + 1);
  }
  std::__cxx11::string::_M_replace_aux
            ((ulong)&this->abbreviations_,(this->abbreviations_)._M_string_length,0,'\x01');
  (this->future_spec_)._M_string_length = 0;
  *(this->future_spec_)._M_dataplus._M_p = '\0';
  this->extended_ = false;
  LocalTime((absolute_lookup *)local_50,this,0x7fffffffffffffff,tt);
  pTVar1[-1].civil_max.f_.y = CONCAT44(local_50._4_4_,local_50._0_4_);
  pTVar1[-1].civil_max.f_.m = (char)local_50._8_4_;
  pTVar1[-1].civil_max.f_.d = SUB41(local_50._8_4_,1);
  pTVar1[-1].civil_max.f_.hh = SUB41(local_50._8_4_,2);
  pTVar1[-1].civil_max.f_.mm = SUB41(local_50._8_4_,3);
  pTVar1[-1].civil_max.f_.ss = (char)local_50._12_4_;
  *(int3 *)&pTVar1[-1].civil_max.f_.field_0xd = SUB43(local_50._12_4_,1);
  LocalTime((absolute_lookup *)local_50,this,-0x8000000000000000,tt);
  pTVar1[-1].civil_min.f_.y = CONCAT44(local_50._4_4_,local_50._0_4_);
  pTVar1[-1].civil_min.f_.m = (char)local_50._8_4_;
  pTVar1[-1].civil_min.f_.d = SUB41(local_50._8_4_,1);
  pTVar1[-1].civil_min.f_.hh = SUB41(local_50._8_4_,2);
  pTVar1[-1].civil_min.f_.mm = SUB41(local_50._8_4_,3);
  pTVar1[-1].civil_min.f_.ss = (char)local_50._12_4_;
  *(int3 *)&pTVar1[-1].civil_min.f_.field_0xd = SUB43(local_50._12_4_,1);
  if ((this->transitions_).
      super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
      (this->transitions_).
      super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    __shrink_to_fit_aux<std::vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>,_true>
    ::_S_do_it(this_00);
  }
  return true;
}

Assistant:

bool TimeZoneInfo::ResetToBuiltinUTC(const seconds& offset) {
  transition_types_.resize(1);
  TransitionType& tt(transition_types_.back());
  tt.utc_offset = static_cast<std::int_least32_t>(offset.count());
  tt.is_dst = false;
  tt.abbr_index = 0;

  // We temporarily add some redundant, contemporary (2015 through 2025)
  // transitions for performance reasons.  See TimeZoneInfo::LocalTime().
  // TODO: Fix the performance issue and remove the extra transitions.
  transitions_.clear();
  transitions_.reserve(12);
  for (const std::int_fast64_t unix_time : {
           -(1LL << 59),  // a "first half" transition
           1420070400LL,  // 2015-01-01T00:00:00+00:00
           1451606400LL,  // 2016-01-01T00:00:00+00:00
           1483228800LL,  // 2017-01-01T00:00:00+00:00
           1514764800LL,  // 2018-01-01T00:00:00+00:00
           1546300800LL,  // 2019-01-01T00:00:00+00:00
           1577836800LL,  // 2020-01-01T00:00:00+00:00
           1609459200LL,  // 2021-01-01T00:00:00+00:00
           1640995200LL,  // 2022-01-01T00:00:00+00:00
           1672531200LL,  // 2023-01-01T00:00:00+00:00
           1704067200LL,  // 2024-01-01T00:00:00+00:00
           1735689600LL,  // 2025-01-01T00:00:00+00:00
       }) {
    Transition& tr(*transitions_.emplace(transitions_.end()));
    tr.unix_time = unix_time;
    tr.type_index = 0;
    tr.civil_sec = LocalTime(tr.unix_time, tt).cs;
    tr.prev_civil_sec = tr.civil_sec - 1;
  }

  default_transition_type_ = 0;
  abbreviations_ = FixedOffsetToAbbr(offset);
  abbreviations_.append(1, '\0');
  future_spec_.clear();  // never needed for a fixed-offset zone
  extended_ = false;

  tt.civil_max = LocalTime(seconds::max().count(), tt).cs;
  tt.civil_min = LocalTime(seconds::min().count(), tt).cs;

  transitions_.shrink_to_fit();
  return true;
}